

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall glslang::TType::shallowCopy(TType *this,TType *copyOf)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  TSpirvType *pTVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  TQualifier *pTVar11;
  TQualifier *pTVar12;
  
  uVar1 = CONCAT31((int3)((uint)*(undefined4 *)&this->field_0x8 >> 8),copyOf->field_0x8);
  *(uint *)&this->field_0x8 = uVar1;
  this->sampler = copyOf->sampler;
  pTVar11 = &copyOf->qualifier;
  pTVar12 = &this->qualifier;
  for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
    pTVar12->semanticName = pTVar11->semanticName;
    pTVar11 = (TQualifier *)&pTVar11->field_0x8;
    pTVar12 = (TQualifier *)&pTVar12->field_0x8;
  }
  uVar6 = *(uint *)&copyOf->field_0x8 & 0xf00;
  *(uint *)&this->field_0x8 = uVar1 & 0xfffff0ff | uVar6;
  uVar7 = *(uint *)&copyOf->field_0x8 & 0xf000;
  *(uint *)&this->field_0x8 = uVar1 & 0xffff00ff | uVar6 | uVar7;
  uVar8 = *(uint *)&copyOf->field_0x8 & 0xf0000;
  *(uint *)&this->field_0x8 = uVar1 & 0xfff000ff | uVar6 | uVar7 | uVar8;
  *(uint *)&this->field_0x8 =
       uVar1 & 0xffe000ff | uVar6 | uVar7 | uVar8 | *(uint *)&copyOf->field_0x8 & 0x100000;
  this->arraySizes = copyOf->arraySizes;
  uVar2 = *(undefined4 *)((long)&copyOf->fieldName + 4);
  uVar3 = *(undefined4 *)&copyOf->typeName;
  uVar4 = *(undefined4 *)((long)&copyOf->typeName + 4);
  *(undefined4 *)&this->fieldName = *(undefined4 *)&copyOf->fieldName;
  *(undefined4 *)((long)&this->fieldName + 4) = uVar2;
  *(undefined4 *)&this->typeName = uVar3;
  *(undefined4 *)((long)&this->typeName + 4) = uVar4;
  (*this->_vptr_TType[0x25])(this);
  this->field_13 = copyOf->field_13;
  pTVar5 = copyOf->spirvType;
  this->typeParameters = copyOf->typeParameters;
  this->spirvType = pTVar5;
  uVar6 = *(uint *)&copyOf->field_0x8 & 0x200000;
  uVar1 = *(uint *)&this->field_0x8;
  *(uint *)&this->field_0x8 = uVar1 & 0xffdfffff | uVar6;
  uVar7 = *(uint *)&copyOf->field_0x8 & 0x400000;
  *(uint *)&this->field_0x8 = uVar1 & 0xff9fffff | uVar6 | uVar7;
  uVar8 = *(uint *)&copyOf->field_0x8 & 0x3800000;
  *(uint *)&this->field_0x8 = uVar1 & 0xfc1fffff | uVar6 | uVar7 | uVar8;
  uVar9 = *(uint *)&copyOf->field_0x8 & 0x4000000;
  *(uint *)&this->field_0x8 = uVar1 & 0xf81fffff | uVar6 | uVar7 | uVar8 | uVar9;
  *(uint *)&this->field_0x8 =
       uVar1 & 0xf01fffff | uVar6 | uVar7 | uVar8 | uVar9 | *(uint *)&copyOf->field_0x8 & 0x8000000;
  return;
}

Assistant:

void shallowCopy(const TType& copyOf)
    {
        basicType = copyOf.basicType;
        sampler = copyOf.sampler;
        qualifier = copyOf.qualifier;
        vectorSize = copyOf.vectorSize;
        matrixCols = copyOf.matrixCols;
        matrixRows = copyOf.matrixRows;
        vector1 = copyOf.vector1;
        arraySizes = copyOf.arraySizes;  // copying the pointer only, not the contents
        fieldName = copyOf.fieldName;
        typeName = copyOf.typeName;
        if (isStruct()) {
            structure = copyOf.structure;
        } else {
            referentType = copyOf.referentType;
        }
        typeParameters = copyOf.typeParameters;
        spirvType = copyOf.spirvType;
        coopmatNV = copyOf.isCoopMatNV();
        coopmatKHR = copyOf.isCoopMatKHR();
        coopmatKHRuse = copyOf.coopmatKHRuse;
        coopmatKHRUseValid = copyOf.coopmatKHRUseValid;
        coopvecNV = copyOf.isCoopVecNV();
    }